

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

char * __thiscall
cmMakefile::ExpandVariablesInString
          (cmMakefile *this,string *source,bool escapeQuotes,bool noEscapes,bool atOnly,
          char *filename,long line,bool removeEmpty,bool replaceAt)

{
  bool bVar1;
  PolicyStatus PVar2;
  MessageType MVar3;
  PolicyID id;
  char *pcVar4;
  bool bVar5;
  string msg;
  string newResult;
  string msg_new;
  string newErrorstr;
  string errorstr;
  string msg_old;
  string msg_input;
  string original;
  
  errorstr._M_dataplus._M_p = (pointer)&errorstr.field_2;
  errorstr._M_string_length = 0;
  original._M_dataplus._M_p = (pointer)&original.field_2;
  original._M_string_length = 0;
  errorstr.field_2._M_local_buf[0] = '\0';
  original.field_2._M_local_buf[0] = '\0';
  if ((!noEscapes || !removeEmpty) && atOnly) {
    std::__cxx11::string::string
              ((string *)&newResult,
               "ExpandVariablesInString @ONLY called on something with escapes.",
               (allocator *)&newErrorstr);
    IssueMessage(this,INTERNAL_ERROR,&newResult,false);
    std::__cxx11::string::~string((string *)&newResult);
    pcVar4 = (source->_M_dataplus)._M_p;
    goto LAB_00288ff2;
  }
  newResult._M_dataplus._M_p = (pointer)&newResult.field_2;
  newResult._M_string_length = 0;
  newErrorstr._M_dataplus._M_p = (pointer)&newErrorstr.field_2;
  newErrorstr._M_string_length = 0;
  newResult.field_2._M_local_buf[0] = '\0';
  newErrorstr.field_2._M_local_buf[0] = '\0';
  PVar2 = cmState::Snapshot::GetPolicy(&this->StateSnapshot,CMP0053);
  if (PVar2 - NEW < 3) {
    MVar3 = ExpandVariablesInStringNew
                      (this,&errorstr,source,escapeQuotes,noEscapes,atOnly,filename,line,removeEmpty
                       ,replaceAt);
    bVar5 = true;
    bVar1 = false;
LAB_00288d8e:
    if (MVar3 == LOG) {
      if (bVar1) {
        bVar1 = std::operator!=(&newResult,source);
        if ((bVar1) || (!bVar5)) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&msg,(cmPolicies *)0x35,id);
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::string((string *)&msg_input,(string *)&original);
          cmsys::SystemTools::ReplaceString(&msg_input,"\n","\n  ");
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::append((string *)&msg);
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::string((string *)&msg_old,(string *)source);
          cmsys::SystemTools::ReplaceString(&msg_old,"\n","\n  ");
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::append((string *)&msg);
          std::__cxx11::string::append((char *)&msg);
          if (bVar5) {
            std::__cxx11::string::string((string *)&msg_new,(string *)&newResult);
            cmsys::SystemTools::ReplaceString(&msg_new,"\n","\n  ");
            std::__cxx11::string::append((char *)&msg);
            std::__cxx11::string::append((string *)&msg);
            std::__cxx11::string::append((char *)&msg);
          }
          else {
            std::__cxx11::string::string((string *)&msg_new,(string *)&newErrorstr);
            cmsys::SystemTools::ReplaceString(&msg_new,"\n","\n  ");
            std::__cxx11::string::append((char *)&msg);
            std::__cxx11::string::append((string *)&msg);
            std::__cxx11::string::append((char *)&msg);
          }
          std::__cxx11::string::~string((string *)&msg_new);
          std::__cxx11::string::append((char *)&msg);
          IssueMessage(this,AUTHOR_WARNING,&msg,false);
          std::__cxx11::string::~string((string *)&msg_old);
          std::__cxx11::string::~string((string *)&msg_input);
          std::__cxx11::string::~string((string *)&msg);
        }
      }
    }
    else {
      if (MVar3 == FATAL_ERROR) {
        cmSystemTools::s_FatalErrorOccured = true;
      }
      IssueMessage(this,MVar3,&errorstr,false);
    }
  }
  else {
    if (PVar2 == OLD) {
      bVar5 = true;
      bVar1 = false;
LAB_00288d63:
      MVar3 = ExpandVariablesInStringOld
                        (this,&errorstr,source,escapeQuotes,noEscapes,atOnly,filename,line,
                         removeEmpty,true);
      goto LAB_00288d8e;
    }
    if (PVar2 == WARN) {
      std::__cxx11::string::_M_assign((string *)&original);
      std::__cxx11::string::_M_assign((string *)&newResult);
      this->SuppressWatches = true;
      MVar3 = ExpandVariablesInStringNew
                        (this,&newErrorstr,&newResult,escapeQuotes,noEscapes,atOnly,filename,line,
                         removeEmpty,replaceAt);
      this->SuppressWatches = false;
      bVar5 = MVar3 == LOG;
      bVar1 = true;
      goto LAB_00288d63;
    }
  }
  pcVar4 = (source->_M_dataplus)._M_p;
  std::__cxx11::string::~string((string *)&newErrorstr);
  std::__cxx11::string::~string((string *)&newResult);
LAB_00288ff2:
  std::__cxx11::string::~string((string *)&original);
  std::__cxx11::string::~string((string *)&errorstr);
  return pcVar4;
}

Assistant:

const char *cmMakefile::ExpandVariablesInString(std::string& source,
                                                bool escapeQuotes,
                                                bool noEscapes,
                                                bool atOnly,
                                                const char* filename,
                                                long line,
                                                bool removeEmpty,
                                                bool replaceAt) const
{
  bool compareResults = false;
  cmake::MessageType mtype = cmake::LOG;
  std::string errorstr;
  std::string original;

  // Sanity check the @ONLY mode.
  if(atOnly && (!noEscapes || !removeEmpty))
    {
    // This case should never be called.  At-only is for
    // configure-file/string which always does no escapes.
    this->IssueMessage(cmake::INTERNAL_ERROR,
                       "ExpandVariablesInString @ONLY called "
                       "on something with escapes.");
    return source.c_str();
    }

  // Variables used in the WARN case.
  std::string newResult;
  std::string newErrorstr;
  cmake::MessageType newError = cmake::LOG;

  switch(this->GetPolicyStatus(cmPolicies::CMP0053))
    {
    case cmPolicies::WARN:
      {
      // Save the original string for the warning.
      original = source;
      newResult = source;
      compareResults = true;
      // Suppress variable watches to avoid calling hooks twice. Suppress new
      // dereferences since the OLD behavior is still what is actually used.
      this->SuppressWatches = true;
      newError =
        ExpandVariablesInStringNew(newErrorstr, newResult, escapeQuotes,
                                   noEscapes, atOnly, filename, line,
                                   removeEmpty, replaceAt);
      this->SuppressWatches = false;
      }
    case cmPolicies::OLD:
      mtype = ExpandVariablesInStringOld(errorstr, source, escapeQuotes,
                                         noEscapes, atOnly, filename,
                                         line, removeEmpty, true);
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      // Messaging here would be *very* verbose.
    case cmPolicies::NEW:
      mtype = ExpandVariablesInStringNew(errorstr, source, escapeQuotes,
                                         noEscapes, atOnly, filename,
                                         line, removeEmpty, replaceAt);
      break;
    }

  // If it's an error in either case, just report the error...
  if(mtype != cmake::LOG)
    {
    if(mtype == cmake::FATAL_ERROR)
      {
      cmSystemTools::SetFatalErrorOccured();
      }
    this->IssueMessage(mtype, errorstr);
    }
  // ...otherwise, see if there's a difference that needs to be warned about.
  else if(compareResults && (newResult != source || newError != mtype))
    {
    std::string msg =
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0053);
    msg += "\n";

    std::string msg_input = original;
    cmSystemTools::ReplaceString(msg_input, "\n", "\n  ");
    msg += "For input:\n  '";
    msg += msg_input;
    msg += "'\n";

    std::string msg_old = source;
    cmSystemTools::ReplaceString(msg_old, "\n", "\n  ");
    msg += "the old evaluation rules produce:\n  '";
    msg += msg_old;
    msg += "'\n";

    if(newError == mtype)
      {
      std::string msg_new = newResult;
      cmSystemTools::ReplaceString(msg_new, "\n", "\n  ");
      msg += "but the new evaluation rules produce:\n  '";
      msg += msg_new;
      msg += "'\n";
      }
    else
      {
      std::string msg_err = newErrorstr;
      cmSystemTools::ReplaceString(msg_err, "\n", "\n  ");
      msg += "but the new evaluation rules produce an error:\n  ";
      msg += msg_err;
      msg += "\n";
      }

    msg +=
      "Using the old result for compatibility since the policy is not set.";

    this->IssueMessage(cmake::AUTHOR_WARNING, msg);
    }

  return source.c_str();
}